

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::Deconvolution_x86_fma::destroy_pipeline(Deconvolution_x86_fma *this,Option *opt)

{
  undefined8 in_RSI;
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x1f8) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x1f8) + 0x28))(*(long **)(in_RDI + 0x1f8),in_RSI);
    if (*(long **)(in_RDI + 0x1f8) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x1f8) + 8))();
    }
    *(undefined8 *)(in_RDI + 0x1f8) = 0;
  }
  if (*(long *)(in_RDI + 0x200) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x200) + 0x28))(*(long **)(in_RDI + 0x200),in_RSI);
    if (*(long **)(in_RDI + 0x200) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x200) + 8))();
    }
    *(undefined8 *)(in_RDI + 0x200) = 0;
  }
  return 0;
}

Assistant:

int Deconvolution_x86_fma::destroy_pipeline(const Option& opt)
{
    if (activation)
    {
        activation->destroy_pipeline(opt);
        delete activation;
        activation = 0;
    }

    if (gemm)
    {
        gemm->destroy_pipeline(opt);
        delete gemm;
        gemm = 0;
    }

    return 0;
}